

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool cinatra::is_valid_utf8(uchar *s,size_t length)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  
  puVar1 = (uint *)(s + length);
  do {
    puVar2 = (uint *)s;
    if (puVar2 == puVar1) {
      return true;
    }
  } while ((puVar2 + 1 <= puVar1) && (s = (uchar *)(puVar2 + 1), (*puVar2 & 0x80808080) == 0));
  lVar3 = (long)puVar2 + 2;
  do {
    if (*(char *)(lVar3 + -2) < '\0') {
      return puVar2 == puVar1;
    }
    puVar4 = (uint *)(lVar3 + -1);
    lVar3 = lVar3 + 1;
  } while (puVar4 != puVar1);
  return true;
}

Assistant:

inline bool is_valid_utf8(unsigned char *s, size_t length) {
  for (unsigned char *e = s + length; s != e;) {
    if (s + 4 <= e && ((*(uint32_t *)s) & 0x80808080) == 0) {
      s += 4;
    }
    else {
      while (!(*s & 0x80)) {
        if (++s == e) {
          return true;
        }
      }

      if ((s[0] & 0x60) == 0x40) {
        if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
          return false;
        }
        s += 2;
      }
      else if ((s[0] & 0xf0) == 0xe0) {
        if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) ||
            (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
          return false;
        }
        s += 3;
      }
      else if ((s[0] & 0xf8) == 0xf0) {
        if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[3] & 0xc0) != 0x80 || (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) ||
            (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
          return false;
        }
        s += 4;
      }
      else {
        return false;
      }
    }
  }
  return true;
}